

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int ar_equation_system_solve(aom_noise_state_t *state,int is_chroma)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long *in_RDI;
  double dVar3;
  double noise_var;
  double bi;
  int i_1;
  double sum_covar;
  int i;
  int n;
  double var;
  int ret;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  aom_equation_system_t *in_stack_ffffffffffffffb8;
  double local_40;
  int local_34;
  double local_30;
  int local_28;
  double local_20;
  
  iVar2 = equation_system_solve(in_stack_ffffffffffffffb8);
  in_RDI[0xd] = 0x3ff0000000000000;
  if (iVar2 != 0) {
    local_20 = 0.0;
    iVar1 = (int)in_RDI[3];
    for (local_28 = 0; local_28 < (int)in_RDI[3] - in_ESI; local_28 = local_28 + 1) {
      local_20 = *(double *)(*in_RDI + (long)(local_28 * iVar1 + local_28) * 8) /
                 (double)(int)in_RDI[0xc] + local_20;
    }
    local_20 = local_20 / (double)(iVar1 - in_ESI);
    local_30 = 0.0;
    for (local_34 = 0; local_34 < (int)in_RDI[3] - in_ESI; local_34 = local_34 + 1) {
      local_40 = *(double *)(in_RDI[1] + (long)local_34 * 8);
      if (in_ESI != 0) {
        local_40 = -*(double *)(*in_RDI + (long)(local_34 * iVar1 + iVar1 + -1) * 8) *
                   *(double *)(in_RDI[2] + (long)(iVar1 + -1) * 8) + local_40;
      }
      local_30 = (local_40 * *(double *)(in_RDI[2] + (long)local_34 * 8)) / (double)(int)in_RDI[0xc]
                 + local_30;
    }
    if (local_20 - local_30 <= 1e-06) {
      local_50 = 1e-06;
    }
    else {
      local_50 = local_20 - local_30;
    }
    if (local_20 / local_50 <= 1e-06) {
      local_58 = 1e-06;
    }
    else {
      local_58 = local_20 / local_50;
    }
    dVar3 = sqrt(local_58);
    if (1.0 <= dVar3) {
      if (local_20 / local_50 <= 1e-06) {
        local_68 = 1e-06;
      }
      else {
        local_68 = local_20 / local_50;
      }
      local_60 = sqrt(local_68);
    }
    else {
      local_60 = 1.0;
    }
    in_RDI[0xd] = (long)local_60;
  }
  return iVar2;
}

Assistant:

static int ar_equation_system_solve(aom_noise_state_t *state, int is_chroma) {
  const int ret = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (!ret) return ret;

  // Update the AR gain from the equation system as it will be used to fit
  // the noise strength as a function of intensity.  In the Yule-Walker
  // equations, the diagonal should be the variance of the correlated noise.
  // In the case of the least squares estimate, there will be some variability
  // in the diagonal. So use the mean of the diagonal as the estimate of
  // overall variance (this works for least squares or Yule-Walker formulation).
  double var = 0;
  const int n = state->eqns.n;
  for (int i = 0; i < (state->eqns.n - is_chroma); ++i) {
    var += state->eqns.A[i * n + i] / state->num_observations;
  }
  var /= (n - is_chroma);

  // Keep track of E(Y^2) = <b, x> + E(X^2)
  // In the case that we are using chroma and have an estimate of correlation
  // with luma we adjust that estimate slightly to remove the correlated bits by
  // subtracting out the last column of a scaled by our correlation estimate
  // from b. E(y^2) = <b - A(:, end)*x(end), x>
  double sum_covar = 0;
  for (int i = 0; i < state->eqns.n - is_chroma; ++i) {
    double bi = state->eqns.b[i];
    if (is_chroma) {
      bi -= state->eqns.A[i * n + (n - 1)] * state->eqns.x[n - 1];
    }
    sum_covar += (bi * state->eqns.x[i]) / state->num_observations;
  }
  // Now, get an estimate of the variance of uncorrelated noise signal and use
  // it to determine the gain of the AR filter.
  const double noise_var = AOMMAX(var - sum_covar, 1e-6);
  state->ar_gain = AOMMAX(1, sqrt(AOMMAX(var / noise_var, 1e-6)));
  return ret;
}